

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O2

void __thiscall FIX::SessionID::fromString(SessionID *this,string *str)

{
  long lVar1;
  long lVar2;
  long lVar3;
  STRING local_b0;
  FieldBase local_90;
  
  lVar1 = std::__cxx11::string::find((char)str,0x3a);
  lVar2 = std::__cxx11::string::find((char *)str,0x2b74da);
  lVar3 = std::__cxx11::string::rfind((char)str,0x3a);
  if (lVar2 != -1 && lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)str);
    BeginString::BeginString((BeginString *)&local_90,&local_b0);
    FieldBase::operator=((FieldBase *)this,&local_90);
    FieldBase::~FieldBase(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)str);
    SenderCompID::SenderCompID((SenderCompID *)&local_90,&local_b0);
    FieldBase::operator=((FieldBase *)&this->m_senderCompID,&local_90);
    FieldBase::~FieldBase(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    if (lVar1 == lVar3) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)str);
      TargetCompID::TargetCompID((TargetCompID *)&local_90,&local_b0);
      FieldBase::operator=((FieldBase *)&this->m_targetCompID,&local_90);
      FieldBase::~FieldBase(&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::assign((char *)&this->m_sessionQualifier);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)str);
      TargetCompID::TargetCompID((TargetCompID *)&local_90,&local_b0);
      FieldBase::operator=((FieldBase *)&this->m_targetCompID,&local_90);
      FieldBase::~FieldBase(&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)str);
      std::__cxx11::string::operator=((string *)&this->m_sessionQualifier,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    toString(this,&this->m_frozenString);
  }
  return;
}

Assistant:

void fromString( const std::string& str )
  {
    std::string::size_type first =
      str.find_first_of(':');
    std::string::size_type second =
      str.find("->");
    std::string::size_type third =
      str.find_last_of(':');
    if( first == std::string::npos )
      return;
    if( second == std::string::npos )
      return;
    m_beginString = str.substr(0, first);
    m_senderCompID = str.substr(first+1, second - first - 1);
    if( first == third )
    {
      m_targetCompID = str.substr(second+2);
      m_sessionQualifier = "";
    }
    else
    {
      m_targetCompID = str.substr(second+2, third - second - 2);
      m_sessionQualifier = str.substr(third+1);
    }
    toString(m_frozenString);
  }